

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int generate_by_wrapper_d(uchar *script,size_t script_len,size_t *write_len)

{
  ulong uVar1;
  size_t __n;
  int iVar2;
  
  __n = *write_len;
  iVar2 = -2;
  if ((__n != 0) && (uVar1 = __n + 3, uVar1 < 0x2711 && uVar1 <= script_len)) {
    memmove(script + 2,script,__n);
    script[0] = 'v';
    script[1] = 'c';
    script[__n + 2] = 'h';
    *write_len = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int generate_by_wrapper_d(
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    size_t used_len = *write_len;
    if (!used_len || (used_len + 3 > script_len) || (used_len + 3 > DESCRIPTOR_WITNESS_SCRIPT_MAX_SIZE))
        return WALLY_EINVAL;

    memmove(script + 2, script, used_len);
    script[0] = OP_DUP;
    script[1] = OP_IF;
    script[used_len + 2] = OP_ENDIF;
    *write_len = used_len + 3;
    return WALLY_OK;
}